

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  char cVar2;
  TestRole TVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  long *plVar8;
  int *piVar9;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  const_iterator __position;
  size_t __len;
  long in_FS_OFFSET;
  int death_test_index;
  ExecDeathTestArgs args_2;
  Arguments args;
  string internal_flag;
  string filter_flag;
  int pipe_fd [2];
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  int local_314;
  string local_310;
  string local_2f0;
  string local_2d0;
  long *local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  int local_270;
  int local_26c;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  long local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  long local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  string local_188;
  _union_1457 local_168;
  undefined1 local_160 [8];
  ulong local_158;
  ulong uStack_150;
  _union_1457 local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_314 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    TVar3 = EXECUTE_TEST;
LAB_0015d000:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return TVar3;
    }
    goto LAB_0015f5be;
  }
  iVar4 = pipe(&local_270);
  if (iVar4 != -1) {
    iVar4 = fcntl(local_26c,2,0);
    if (iVar4 == -1) {
      local_1e8 = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      local_1c8 = (ulong *)*puVar7;
      puVar10 = puVar7 + 2;
      if (local_1c8 == puVar10) {
        local_1b8 = *puVar10;
        uStack_1b0 = puVar7[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *puVar10;
      }
      local_1c0 = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
      local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_1a8 == paVar13) {
        local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_198._8_8_ = puVar7[3];
        local_1a8 = &local_198;
      }
      else {
        local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_1a0 = puVar7[1];
      *puVar7 = paVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_228._M_dataplus._M_p._0_4_ = 0x546;
      StreamableToString<int>(&local_208,(int *)&local_228);
      uVar17 = 0xf;
      if (local_1a8 != &local_198) {
        uVar17 = local_198._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_208._M_string_length + local_1a0) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar17 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_208._M_string_length + local_1a0) goto LAB_0015ddf5;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_1a8);
      }
      else {
LAB_0015ddf5:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1a8,(ulong)local_208._M_dataplus._M_p);
      }
      local_188._M_dataplus._M_p = (pointer)*puVar7;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar13) {
        local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_188.field_2._8_8_ = puVar7[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_188._M_string_length = puVar7[1];
      *puVar7 = paVar13;
      puVar7[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      local_168.sa_handler = (__sighandler_t)*puVar7;
      p_Var11 = (__sighandler_t)(puVar7 + 2);
      if (local_168.sa_handler == p_Var11) {
        local_158 = *(ulong *)p_Var11;
        uStack_150 = puVar7[3];
        local_168.sa_handler = (__sighandler_t)&local_158;
      }
      else {
        local_158 = *(ulong *)p_Var11;
      }
      local_160 = (undefined1  [8])puVar7[1];
      *puVar7 = p_Var11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
      local_d0.sa_handler = (__sighandler_t)*puVar7;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.sa_handler != paVar13) goto LAB_0015e941;
      local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_c0[0]._8_8_ = puVar7[3];
      local_d0.sa_handler = (__sighandler_t)local_c0;
      goto LAB_0015e954;
    }
    local_1e8 = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"--","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar10 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar10) {
      local_1b8 = *puVar10;
      uStack_1b0 = puVar7[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar10;
      local_1c8 = (ulong *)*puVar7;
    }
    local_1c0 = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar13) {
      local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_198._8_8_ = plVar8[3];
      local_1a8 = &local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8;
    }
    local_1a0 = plVar8[1];
    *plVar8 = (long)paVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar13) {
      local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_188.field_2._8_8_ = plVar8[3];
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_188._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_188._M_string_length = plVar8[1];
    *plVar8 = (long)paVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
    local_168.sa_handler = (__sighandler_t)&local_158;
    p_Var11 = (__sighandler_t)(plVar8 + 2);
    if ((__sighandler_t)*plVar8 == p_Var11) {
      local_158 = *(ulong *)p_Var11;
      uStack_150 = plVar8[3];
    }
    else {
      local_158 = *(ulong *)p_Var11;
      local_168.sa_handler = (__sighandler_t)*plVar8;
    }
    local_160 = (undefined1  [8])plVar8[1];
    *plVar8 = (long)p_Var11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar13) {
      local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_c0[0]._8_8_ = puVar7[3];
      local_d0.sa_handler = (__sighandler_t)local_c0;
    }
    else {
      local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_d0.sa_handler = (__sighandler_t)*puVar7;
    }
    local_c8 = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_290 = &local_280;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_280 = *plVar12;
      lStack_278 = plVar8[3];
    }
    else {
      local_280 = *plVar12;
      local_290 = (long *)*plVar8;
    }
    local_288 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.sa_handler != local_c0) {
      operator_delete(local_d0.sa_handler,local_c0[0]._M_allocated_capacity + 1);
    }
    if (local_168.sa_handler != (__sighandler_t)&local_158) {
      operator_delete(local_168.sa_handler,local_158 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
    }
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    puVar10 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248.field_2._8_8_ = plVar8[3];
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_248._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_248);
    puVar10 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228.field_2._8_8_ = plVar8[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_228._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_228);
    puVar10 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_208.field_2._M_allocated_capacity = *puVar10;
      local_208.field_2._8_8_ = plVar8[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *puVar10;
      local_208._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_208._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar13) {
      local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_1d8._8_8_ = puVar7[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
    }
    local_1e0 = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    puVar10 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar10) {
      local_1b8 = *puVar10;
      uStack_1b0 = puVar7[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar10;
      local_1c8 = (ulong *)*puVar7;
    }
    local_1c0 = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    StreamableToString<int>(&local_2d0,&this->line_);
    uVar16 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar16 = local_1b8;
    }
    if (uVar16 < local_2d0._M_string_length + local_1c0) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        uVar17 = local_2d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_2d0._M_string_length + local_1c0) goto LAB_0015c75f;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_1c8);
    }
    else {
LAB_0015c75f:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_2d0._M_dataplus._M_p)
      ;
    }
    local_1a8 = &local_198;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar13) {
      local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_198._8_8_ = puVar7[3];
    }
    else {
      local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
    }
    local_1a0 = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar13) {
      local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_188.field_2._8_8_ = puVar7[3];
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_188._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_188._M_string_length = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    StreamableToString<int>(&local_2f0,&local_314);
    uVar16 = CONCAT44(local_2f0._M_string_length._4_4_,(int)local_2f0._M_string_length) +
             local_188._M_string_length;
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      uVar17 = local_188.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < uVar16) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        uVar17 = local_2f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < uVar16) goto LAB_0015c8a2;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
    }
    else {
LAB_0015c8a2:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_2f0._M_dataplus._M_p)
      ;
    }
    local_168.sa_handler = (__sighandler_t)&local_158;
    p_Var11 = (__sighandler_t)(puVar7 + 2);
    if ((__sighandler_t)*puVar7 == p_Var11) {
      local_158 = *(ulong *)p_Var11;
      uStack_150 = puVar7[3];
    }
    else {
      local_158 = *(ulong *)p_Var11;
      local_168.sa_handler = (__sighandler_t)*puVar7;
    }
    local_160 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var11;
    puVar7[1] = 0;
    *p_Var11 = (__sighandler_t)0x0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 == paVar13) {
      local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_c0[0]._8_8_ = puVar7[3];
      local_d0.sa_handler = (__sighandler_t)local_c0;
    }
    else {
      local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_d0.sa_handler = (__sighandler_t)*puVar7;
    }
    local_c8 = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    StreamableToString<int>(&local_310,&local_26c);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.sa_handler != local_c0) {
      uVar17 = local_c0[0]._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_c8 + local_310._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_310._M_dataplus._M_p._4_4_,local_310._M_dataplus._M_p._0_4_) !=
          &local_310.field_2) {
        uVar17 = local_310.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_c8 + local_310._M_string_length) goto LAB_0015c9da;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_0015c9da:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_d0,
                          CONCAT44(local_310._M_dataplus._M_p._4_4_,local_310._M_dataplus._M_p._0_4_
                                  ));
    }
    local_2b0 = &local_2a0;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_2a0 = *plVar8;
      uStack_298 = puVar7[3];
    }
    else {
      local_2a0 = *plVar8;
      local_2b0 = (long *)*puVar7;
    }
    local_2a8 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_310._M_dataplus._M_p._4_4_,local_310._M_dataplus._M_p._0_4_) !=
        &local_310.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_310._M_dataplus._M_p._4_4_,local_310._M_dataplus._M_p._0_4_),
                      local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.sa_handler != local_c0) {
      operator_delete(local_d0.sa_handler,local_c0[0]._M_allocated_capacity + 1);
    }
    if (local_168.sa_handler != (__sighandler_t)&local_158) {
      operator_delete(local_168.sa_handler,local_158 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    Arguments::Arguments((Arguments *)&local_2d0);
    GetInjectableArgvs_abi_cxx11_();
    Arguments::AddArguments<std::__cxx11::string>
              ((Arguments *)&local_2d0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d0);
    __position._M_current = (char **)(local_2d0._M_string_length - 8);
    local_d0.sa_handler = (__sighandler_t)strdup((char *)local_290);
    std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
              ((vector<char_*,_std::allocator<char_*>_> *)&local_2d0,__position,
               (value_type *)&local_d0.sa_handler);
    local_d0.sa_handler = (__sighandler_t)strdup((char *)local_2b0);
    std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
              ((vector<char_*,_std::allocator<char_*>_> *)&local_2d0,
               (char **)(local_2d0._M_string_length - 8),(value_type *)&local_d0.sa_handler);
    local_d0.sa_handler = (__sighandler_t)local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.sa_handler != local_c0) {
      operator_delete(local_d0.sa_handler,local_c0[0]._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    local_2f0._M_dataplus._M_p = local_2d0._M_dataplus._M_p;
    local_2f0._M_string_length._0_4_ = local_270;
    memset(&local_168,0,0x98);
    sigemptyset((sigset_t *)local_160);
    local_168 = (_union_1457)0x1;
    do {
      iVar4 = sigaction(0x1b,(sigaction *)&local_168,(sigaction *)&local_d0);
      cVar2 = FLAGS_gtest_death_test_use_fork;
      if (iVar4 != -1) {
        iVar4 = -1;
        if (FLAGS_gtest_death_test_use_fork == '\0') {
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
            AssumeRole();
          }
          uVar5 = getpagesize();
          __len = (size_t)(int)uVar5;
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
            local_208._M_dataplus._M_p = (pointer)*puVar7;
            puVar10 = puVar7 + 2;
            if ((ulong *)local_208._M_dataplus._M_p == puVar10) {
              local_208.field_2._M_allocated_capacity = *puVar10;
              local_208.field_2._8_8_ = puVar7[3];
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            }
            else {
              local_208.field_2._M_allocated_capacity = *puVar10;
            }
            local_208._M_string_length = puVar7[1];
            *puVar7 = puVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
            local_1e8 = &local_1d8;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (paVar13 != paVar14) goto LAB_0015e127;
            local_1d8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_1d8._8_8_ = puVar7[3];
            goto LAB_0015e13a;
          }
          lVar15 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar15 = __len - 0x40;
          }
          if ((0x40 < uVar5) && (((ulong)(lVar15 + (long)__addr) & 0x3f) == 0)) {
            iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar15 + (long)__addr),0x11,&local_2f0);
            iVar6 = munmap(__addr,__len);
            if (iVar6 != -1) goto LAB_0015ce65;
            goto LAB_0015d618;
          }
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
          local_208._M_dataplus._M_p = (pointer)*puVar7;
          puVar10 = puVar7 + 2;
          if ((ulong *)local_208._M_dataplus._M_p == puVar10) {
            local_208.field_2._M_allocated_capacity = *puVar10;
            local_208.field_2._8_8_ = puVar7[3];
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          }
          else {
            local_208.field_2._M_allocated_capacity = *puVar10;
          }
          local_208._M_string_length = puVar7[1];
          *puVar7 = puVar10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
          local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if (local_1e8 == paVar13) {
            local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_1d8._8_8_ = puVar7[3];
            local_1e8 = &local_1d8;
          }
          else {
            local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_1e0 = puVar7[1];
          *puVar7 = paVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_268._M_dataplus._M_p._0_4_ = 0x51a;
          StreamableToString<int>(&local_248,(int *)&local_268);
          uVar17 = 0xf;
          if (local_1e8 != &local_1d8) {
            uVar17 = local_1d8._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_248._M_string_length + local_1e0) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              uVar17 = local_248.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_248._M_string_length + local_1e0) goto LAB_0015e299;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_1e8)
            ;
          }
          else {
LAB_0015e299:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_1e8,(ulong)local_248._M_dataplus._M_p);
          }
          local_1c8 = (ulong *)*puVar7;
          puVar10 = puVar7 + 2;
          if (local_1c8 == puVar10) {
            local_1b8 = *puVar10;
            uStack_1b0 = puVar7[3];
            local_1c8 = &local_1b8;
          }
          else {
            local_1b8 = *puVar10;
          }
          local_1c0 = puVar7[1];
          *puVar7 = puVar10;
          puVar7[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
          local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if (local_1a8 == paVar13) {
            local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_198._8_8_ = puVar7[3];
            local_1a8 = &local_198;
          }
          else {
            local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_1a0 = puVar7[1];
          *puVar7 = paVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if (paVar13 != paVar14) goto LAB_0015eb93;
          local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_188.field_2._8_8_ = puVar7[3];
          goto LAB_0015eba6;
        }
LAB_0015ce65:
        if (cVar2 != '\0') {
          iVar4 = fork();
          if (iVar4 == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
            ExecDeathTestChildMain(&local_2f0);
LAB_0015d618:
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_228,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
            local_208._M_dataplus._M_p = (pointer)*puVar7;
            puVar10 = puVar7 + 2;
            if ((ulong *)local_208._M_dataplus._M_p == puVar10) {
              local_208.field_2._M_allocated_capacity = *puVar10;
              local_208.field_2._8_8_ = puVar7[3];
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            }
            else {
              local_208.field_2._M_allocated_capacity = *puVar10;
            }
            local_208._M_string_length = puVar7[1];
            *puVar7 = puVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
            local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (local_1e8 == paVar13) {
              local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_1d8._8_8_ = puVar7[3];
              local_1e8 = &local_1d8;
            }
            else {
              local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            }
            local_1e0 = puVar7[1];
            *puVar7 = paVar13;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            local_268._M_dataplus._M_p._0_4_ = 0x51e;
            StreamableToString<int>(&local_248,(int *)&local_268);
            uVar17 = 0xf;
            if (local_1e8 != &local_1d8) {
              uVar17 = local_1d8._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_248._M_string_length + local_1e0) {
              uVar17 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                uVar17 = local_248.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar17 < local_248._M_string_length + local_1e0) goto LAB_0015e35f;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_248,0,(char *)0x0,(ulong)local_1e8);
            }
            else {
LAB_0015e35f:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1e8,(ulong)local_248._M_dataplus._M_p);
            }
            local_1c8 = (ulong *)*puVar7;
            puVar10 = puVar7 + 2;
            if (local_1c8 == puVar10) {
              local_1b8 = *puVar10;
              uStack_1b0 = puVar7[3];
              local_1c8 = &local_1b8;
            }
            else {
              local_1b8 = *puVar10;
            }
            local_1c0 = puVar7[1];
            *puVar7 = puVar10;
            puVar7[1] = 0;
            *(undefined1 *)puVar10 = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (local_1a8 == paVar13) {
              local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_198._8_8_ = puVar7[3];
              local_1a8 = &local_198;
            }
            else {
              local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
            }
            local_1a0 = puVar7[1];
            *puVar7 = paVar13;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if (paVar13 != paVar14) goto LAB_0015ebe5;
            local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_188.field_2._8_8_ = puVar7[3];
            goto LAB_0015ebf8;
          }
        }
        goto LAB_0015ce81;
      }
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CHECK failed: File ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_228._M_dataplus._M_p = (pointer)*plVar8;
    puVar10 = (ulong *)(plVar8 + 2);
    if ((ulong *)local_228._M_dataplus._M_p == puVar10) {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228.field_2._8_8_ = plVar8[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar10;
    }
    local_228._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_208._M_dataplus._M_p = (pointer)*plVar8;
    puVar10 = (ulong *)(plVar8 + 2);
    if ((ulong *)local_208._M_dataplus._M_p == puVar10) {
      local_208.field_2._M_allocated_capacity = *puVar10;
      local_208.field_2._8_8_ = plVar8[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *puVar10;
    }
    local_208._M_string_length = plVar8[1];
    *plVar8 = (long)puVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_310._M_dataplus._M_p._0_4_ = 0x501;
    StreamableToString<int>(&local_268,(int *)&local_310);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_268._M_string_length + local_208._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar17 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_268._M_string_length + local_208._M_string_length)
      goto LAB_0015d22e;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_268,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
    }
    else {
LAB_0015d22e:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_1e8 == paVar13) {
      local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_1d8._8_8_ = puVar7[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_1e0 = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
    local_1c8 = (ulong *)*puVar7;
    puVar10 = puVar7 + 2;
    if (local_1c8 == puVar10) {
      local_1b8 = *puVar10;
      uStack_1b0 = puVar7[3];
      local_1c8 = &local_1b8;
    }
    else {
      local_1b8 = *puVar10;
    }
    local_1c0 = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if (local_1a8 == paVar13) {
      local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_198._8_8_ = puVar7[3];
      local_1a8 = &local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_1a0 = puVar7[1];
    *puVar7 = paVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    local_188._M_dataplus._M_p = (pointer)*puVar7;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == paVar14) {
      local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_188.field_2._8_8_ = puVar7[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_188._M_string_length = puVar7[1];
    *puVar7 = paVar14;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
    DeathTestAbort(&local_188);
    puVar7 = extraout_RAX;
    paVar13 = extraout_RDX;
    goto LAB_0015e083;
  }
  local_1e8 = &local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = (ulong *)*puVar7;
  puVar10 = puVar7 + 2;
  if (local_1c8 == puVar10) {
    local_1b8 = *puVar10;
    uStack_1b0 = puVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
  }
  local_1c0 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_1a8 == paVar13) {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_198._8_8_ = puVar7[3];
    local_1a8 = &local_198;
  }
  else {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_1a0 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_228._M_dataplus._M_p._0_4_ = 0x543;
  StreamableToString<int>(&local_208,(int *)&local_228);
  uVar17 = 0xf;
  if (local_1a8 != &local_198) {
    uVar17 = local_198._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_208._M_string_length + local_1a0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_208._M_string_length + local_1a0) goto LAB_0015dd3b;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_1a8);
  }
  else {
LAB_0015dd3b:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_208._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p == paVar13) {
    local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_188.field_2._8_8_ = puVar7[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_188._M_string_length = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
  local_168.sa_handler = (__sighandler_t)*puVar7;
  p_Var11 = (__sighandler_t)(puVar7 + 2);
  if (local_168.sa_handler == p_Var11) {
    local_158 = *(ulong *)p_Var11;
    uStack_150 = puVar7[3];
    local_168.sa_handler = (__sighandler_t)&local_158;
  }
  else {
    local_158 = *(ulong *)p_Var11;
  }
  local_160 = (undefined1  [8])puVar7[1];
  *puVar7 = p_Var11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  local_d0.sa_handler = (__sighandler_t)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.sa_handler == paVar13) {
    local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_c0[0]._8_8_ = puVar7[3];
    local_d0.sa_handler = (__sighandler_t)local_c0;
  }
  else {
    local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_c8 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
  DeathTestAbort((string *)&local_d0);
  puVar7 = extraout_RAX_02;
  local_d0 = extraout_RDX_02;
LAB_0015e941:
  local_c0[0]._0_8_ = paVar13->_M_allocated_capacity;
LAB_0015e954:
  local_c8 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
  DeathTestAbort((string *)&local_d0);
  puVar7 = extraout_RAX_03;
  local_1a8 = extraout_RDX_03;
  goto LAB_0015e993;
  while( true ) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) break;
LAB_0015ce81:
    iVar6 = sigaction(0x1b,(sigaction *)&local_d0,(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar4 != -1) goto LAB_0015cf18;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
      local_208._M_dataplus._M_p = (pointer)*puVar7;
      puVar10 = puVar7 + 2;
      if ((ulong *)local_208._M_dataplus._M_p == puVar10) {
        local_208.field_2._M_allocated_capacity = *puVar10;
        local_208.field_2._8_8_ = puVar7[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *puVar10;
      }
      local_208._M_string_length = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
      local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_1e8 == paVar13) {
        local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_1d8._8_8_ = puVar7[3];
        local_1e8 = &local_1d8;
      }
      else {
        local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_1e0 = puVar7[1];
      *puVar7 = paVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_268._M_dataplus._M_p._0_4_ = 0x52e;
      StreamableToString<int>(&local_248,(int *)&local_268);
      uVar17 = 0xf;
      if (local_1e8 != &local_1d8) {
        uVar17 = local_1d8._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_248._M_string_length + local_1e0) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          uVar17 = local_248.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_248._M_string_length + local_1e0) goto LAB_0015e017;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_1e8);
      }
      else {
LAB_0015e017:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1e8,(ulong)local_248._M_dataplus._M_p);
      }
      local_1c8 = (ulong *)*puVar7;
      puVar10 = puVar7 + 2;
      if (local_1c8 == puVar10) {
        local_1b8 = *puVar10;
        uStack_1b0 = puVar7[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *puVar10;
      }
      local_1c0 = puVar7[1];
      *puVar7 = puVar10;
      puVar7[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
      local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if (local_1a8 == paVar13) {
        local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_198._8_8_ = puVar7[3];
        local_1a8 = &local_198;
      }
      else {
        local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_1a0 = puVar7[1];
      *puVar7 = paVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
      local_188._M_dataplus._M_p = (pointer)*puVar7;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar14) {
        local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_188.field_2._8_8_ = puVar7[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_188._M_string_length = puVar7[1];
      *puVar7 = paVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
      DeathTestAbort(&local_188);
      puVar7 = extraout_RAX_04;
      local_188._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0015eb41;
    }
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
  local_228._M_dataplus._M_p = (pointer)*puVar7;
  puVar10 = puVar7 + 2;
  if ((ulong *)local_228._M_dataplus._M_p == puVar10) {
    local_228.field_2._M_allocated_capacity = *puVar10;
    local_228.field_2._8_8_ = puVar7[3];
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *puVar10;
  }
  local_228._M_string_length = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
  local_208._M_dataplus._M_p = (pointer)*puVar7;
  puVar10 = puVar7 + 2;
  if ((ulong *)local_208._M_dataplus._M_p == puVar10) {
    local_208.field_2._M_allocated_capacity = *puVar10;
    local_208.field_2._8_8_ = puVar7[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *puVar10;
  }
  local_208._M_string_length = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_310._M_dataplus._M_p._0_4_ = 0x52b;
  StreamableToString<int>(&local_268,(int *)&local_310);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    uVar17 = local_208.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_268._M_string_length + local_208._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      uVar17 = local_268.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_268._M_string_length + local_208._M_string_length) goto LAB_0015d2f1;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_268,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
  }
  else {
LAB_0015d2f1:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_268._M_dataplus._M_p);
  }
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_1e8 == paVar13) {
    local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1d8._8_8_ = puVar7[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_1e0 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = (ulong *)*puVar7;
  puVar10 = puVar7 + 2;
  if (local_1c8 == puVar10) {
    local_1b8 = *puVar10;
    uStack_1b0 = puVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
  }
  local_1c0 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_1a8 == paVar13) {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_198._8_8_ = puVar7[3];
    local_1a8 = &local_198;
  }
  else {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_1a0 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (paVar13 == paVar14) {
    local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_188.field_2._8_8_ = puVar7[3];
  }
  else {
LAB_0015e083:
    local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_188._M_dataplus._M_p = (pointer)paVar13;
  }
  local_188._M_string_length = puVar7[1];
  *puVar7 = paVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
  DeathTestAbort(&local_188);
  puVar7 = extraout_RAX_00;
  local_d0 = extraout_RDX_00;
LAB_0015e0d5:
  local_c0[0]._0_8_ = paVar14->_M_allocated_capacity;
  goto LAB_0015e0e8;
  while( true ) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) break;
LAB_0015cf18:
    iVar6 = close(local_26c);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_270;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_2d0);
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      TVar3 = OVERSEE_TEST;
      goto LAB_0015d000;
    }
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_1e8 == paVar13) {
    local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1d8._8_8_ = puVar7[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_1e0 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = (ulong *)*puVar7;
  puVar10 = puVar7 + 2;
  if (local_1c8 == puVar10) {
    local_1b8 = *puVar10;
    uStack_1b0 = puVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
  }
  local_1c0 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_248._M_dataplus._M_p._0_4_ = 0x55d;
  StreamableToString<int>(&local_228,(int *)&local_248);
  uVar16 = 0xf;
  if (local_1c8 != &local_1b8) {
    uVar16 = local_1b8;
  }
  if (uVar16 < local_228._M_string_length + local_1c0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar17 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_228._M_string_length + local_1c0) goto LAB_0015d3b7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_1c8);
  }
  else {
LAB_0015d3b7:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_228._M_dataplus._M_p);
  }
  local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_1a8 == paVar13) {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_198._8_8_ = puVar7[3];
    local_1a8 = &local_198;
  }
  else {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_1a0 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
  local_188._M_dataplus._M_p = (pointer)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p == paVar13) {
    local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_188.field_2._8_8_ = puVar7[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_188._M_string_length = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_168.sa_handler = (__sighandler_t)*plVar8;
  p_Var11 = (__sighandler_t)(plVar8 + 2);
  if (local_168.sa_handler == p_Var11) {
    local_158 = *(ulong *)p_Var11;
    uStack_150 = plVar8[3];
    local_168.sa_handler = (__sighandler_t)&local_158;
  }
  else {
    local_158 = *(ulong *)p_Var11;
  }
  local_160 = (undefined1  [8])plVar8[1];
  *plVar8 = (long)p_Var11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  local_d0.sa_handler = (__sighandler_t)*puVar7;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.sa_handler != paVar14) goto LAB_0015e0d5;
  local_c0[0]._0_8_ = paVar14->_M_allocated_capacity;
  local_c0[0]._8_8_ = puVar7[3];
  local_d0.sa_handler = (__sighandler_t)local_c0;
LAB_0015e0e8:
  local_c8 = puVar7[1];
  *puVar7 = paVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0015f5be;
  DeathTestAbort((string *)&local_d0);
  puVar7 = extraout_RAX_01;
  paVar13 = extraout_RDX_01;
LAB_0015e127:
  local_1d8._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_1e8 = paVar13;
LAB_0015e13a:
  local_1e0 = puVar7[1];
  *puVar7 = paVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_268._M_dataplus._M_p._0_4_ = 0x50d;
  StreamableToString<int>(&local_248,(int *)&local_268);
  uVar17 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar17 = local_1d8._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_248._M_string_length + local_1e0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_248._M_string_length + local_1e0) goto LAB_0015e1d3;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_1e8);
  }
  else {
LAB_0015e1d3:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_248._M_dataplus._M_p);
  }
  local_1c8 = (ulong *)*puVar7;
  puVar10 = puVar7 + 2;
  if (local_1c8 == puVar10) {
    local_1b8 = *puVar10;
    uStack_1b0 = puVar7[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
  }
  local_1c0 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if (local_1a8 == paVar13) {
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_198._8_8_ = puVar7[3];
    local_1a8 = &local_198;
  }
  else {
LAB_0015e993:
    local_198._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_1a0 = puVar7[1];
  *puVar7 = paVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
  local_188._M_dataplus._M_p = (pointer)*puVar7;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p == paVar14) {
    local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_188.field_2._8_8_ = puVar7[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
LAB_0015eb41:
    local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_188._M_string_length = puVar7[1];
  *puVar7 = paVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    DeathTestAbort(&local_188);
    puVar7 = extraout_RAX_05;
    paVar13 = extraout_RDX_05;
LAB_0015eb93:
    local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_188._M_dataplus._M_p = (pointer)paVar13;
LAB_0015eba6:
    local_188._M_string_length = puVar7[1];
    *puVar7 = paVar14;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      DeathTestAbort(&local_188);
      puVar7 = extraout_RAX_06;
      paVar13 = extraout_RDX_06;
LAB_0015ebe5:
      local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_188._M_dataplus._M_p = (pointer)paVar13;
LAB_0015ebf8:
      local_188._M_string_length = puVar7[1];
      *puVar7 = paVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        DeathTestAbort(&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198._M_allocated_capacity + 1);
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8,local_1b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        Arguments::~Arguments((Arguments *)&local_2d0);
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0,local_2a0 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(extraout_RAX_07);
        }
      }
    }
  }
LAB_0015f5be:
  __stack_chk_fail();
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}